

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O1

TIntermTyped * __thiscall
glslang::HlslParseContext::indexStructBufferContent
          (HlslParseContext *this,TSourceLoc *loc,TIntermTyped *buffer)

{
  long lVar1;
  char cVar2;
  int iVar3;
  undefined4 extraout_var;
  TType *pTVar4;
  long *plVar5;
  TIntermConstantUnion *index;
  TIntermTyped *pTVar6;
  HlslParseContext *this_00;
  undefined4 extraout_var_00;
  
  if (buffer != (TIntermTyped *)0x0) {
    this_00 = (HlslParseContext *)buffer;
    iVar3 = (*(buffer->super_TIntermNode)._vptr_TIntermNode[0x1e])();
    pTVar4 = getStructBufferContentType(this_00,(TType *)CONCAT44(extraout_var,iVar3));
    if (pTVar4 != (TType *)0x0) {
      iVar3 = (*(buffer->super_TIntermNode)._vptr_TIntermNode[0x1e])(buffer);
      plVar5 = (long *)CONCAT44(extraout_var_00,iVar3);
      cVar2 = (**(code **)(*plVar5 + 0x128))(plVar5);
      if (cVar2 != '\0') {
        lVar1 = plVar5[0xd];
        index = TIntermediate::addConstantUnion
                          ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                           (int)((ulong)(*(long *)(lVar1 + 0x10) - *(long *)(lVar1 + 8)) >> 5) - 1,
                           loc,false);
        pTVar6 = TIntermediate::addIndex
                           ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                            EOpIndexDirectStruct,buffer,&index->super_TIntermTyped,loc);
        (*(pTVar6->super_TIntermNode)._vptr_TIntermNode[0x1d])
                  (pTVar6,*(undefined8 *)(*(long *)(lVar1 + 0x10) + -0x20));
        return pTVar6;
      }
      __assert_fail("isStruct()",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                    ,0x9df,"const TTypeList *glslang::TType::getStruct() const");
    }
  }
  return (TIntermTyped *)0x0;
}

Assistant:

TIntermTyped* HlslParseContext::indexStructBufferContent(const TSourceLoc& loc, TIntermTyped* buffer) const
{
    // Bail out if not a struct buffer
    if (buffer == nullptr || ! isStructBufferType(buffer->getType()))
        return nullptr;

    // Runtime sized array is always the last element.
    const TTypeList* bufferStruct = buffer->getType().getStruct();
    TIntermTyped* arrayPosition = intermediate.addConstantUnion(unsigned(bufferStruct->size()-1), loc);

    TIntermTyped* argArray = intermediate.addIndex(EOpIndexDirectStruct, buffer, arrayPosition, loc);
    argArray->setType(*(*bufferStruct)[bufferStruct->size()-1].type);

    return argArray;
}